

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfont.cpp
# Opt level: O2

optional<QFont::Tag> __thiscall QFont::Tag::fromString(Tag *this,QAnyStringView view)

{
  uint uVar1;
  _Optional_payload_base<QFont::Tag> _Var2;
  long in_FS_OFFSET;
  char local_30 [24];
  char *local_18;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  if (((ulong)view.field_0.m_data & 0x3fffffffffffffff) == 4) {
    uVar1 = (int)*(char *)((long)&this->m_value + 2) << 8 | (int)*(char *)((long)&this->m_value + 3)
            | (int)*(char *)((long)&this->m_value + 1) << 0x10 | (uint)(byte)this->m_value << 0x18;
    _Var2._M_engaged = uVar1 != 0;
    _Var2._M_payload = (_Storage<QFont::Tag,_true>)uVar1;
    _Var2._5_3_ = 0;
  }
  else {
    local_30[0] = '\x02';
    local_30[1] = '\0';
    local_30[2] = '\0';
    local_30[3] = '\0';
    local_30[0x14] = '\0';
    local_30[0x15] = '\0';
    local_30[0x16] = '\0';
    local_30[0x17] = '\0';
    local_30[4] = '\0';
    local_30[5] = '\0';
    local_30[6] = '\0';
    local_30[7] = '\0';
    local_30[8] = '\0';
    local_30[9] = '\0';
    local_30[10] = '\0';
    local_30[0xb] = '\0';
    local_30[0xc] = '\0';
    local_30[0xd] = '\0';
    local_30[0xe] = '\0';
    local_30[0xf] = '\0';
    local_30[0x10] = '\0';
    local_30[0x11] = '\0';
    local_30[0x12] = '\0';
    local_30[0x13] = '\0';
    local_18 = "default";
    _Var2._M_payload = (_Storage<QFont::Tag,_true>)0x0;
    _Var2._M_engaged = false;
    _Var2._5_3_ = 0;
    QMessageLogger::warning(local_30,"The tag name must be exactly 4 characters long!",view.m_size);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_10) {
    __stack_chk_fail();
  }
  return (optional<QFont::Tag>)_Var2;
}

Assistant:

std::optional<QFont::Tag> QFont::Tag::fromString(QAnyStringView view) noexcept
{
    if (view.size() != 4) {
        qWarning("The tag name must be exactly 4 characters long!");
        return std::nullopt;
    }
    const QFont::Tag maybeTag = view.visit([](auto view) {
        using CharType = decltype(view.at(0));
        if constexpr (std::is_same_v<CharType, char>) {
            const char bytes[5] = { view.at(0), view.at(1), view.at(2), view.at(3), 0 };
            return Tag(bytes);
        } else {
            const char bytes[5] = { view.at(0).toLatin1(), view.at(1).toLatin1(),
                                    view.at(2).toLatin1(), view.at(3).toLatin1(), 0 };
            return Tag(bytes);
        }
    });
    return maybeTag.isValid() ? std::optional<Tag>(maybeTag) : std::nullopt;
}